

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ZSTD_compressionParameters cParams;
  size_t sVar1;
  ZSTD_compressionParameters local_30;
  
  ZSTD_getCParams_internal
            (&local_30,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  cParams.hashLog = local_30.hashLog;
  cParams.windowLog = local_30.windowLog;
  cParams.chainLog = local_30.chainLog;
  cParams.searchLog = local_30.searchLog;
  cParams.minMatch = local_30.minMatch;
  cParams.targetLength = local_30.targetLength;
  cParams.strategy = local_30.strategy;
  sVar1 = ZSTD_estimateCDictSize_advanced(dictSize,cParams,ZSTD_dlm_byCopy);
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}